

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::render
          (QWidgetPrivate *this,QPaintDevice *target,QPoint *targetOffset,QRegion *sourceRegion,
          RenderFlags renderFlags)

{
  long *plVar1;
  long *plVar2;
  QWExtra *pQVar3;
  long lVar4;
  QWidgetPrivate *this_00;
  char cVar5;
  int iVar6;
  undefined8 uVar7;
  QPaintDevice *pQVar8;
  long lVar9;
  QPaintDevice *pQVar10;
  QPainter *pQVar11;
  uint uVar12;
  byte bVar13;
  long in_FS_OFFSET;
  QRegion targetSystemClip;
  QPoint offset;
  QRegion paintRegion;
  long local_68;
  QRegion local_58;
  QRegion local_50;
  QPoint local_48;
  QRegion local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (target == (QPaintDevice *)0x0) {
    render();
    goto LAB_00303954;
  }
  pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar3 == (QWExtra *)0x0) {
    bVar13 = 0;
  }
  else {
    bVar13 = (pQVar3->field_0x7c & 0x40) >> 6;
  }
  local_40.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  if (bVar13 == 0) {
    prepareToRender((QWidgetPrivate *)&stack0xffffffffffffffc0,(QRegion *)this,
                    (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84(sourceRegion,0));
  }
  else {
    QRegion::QRegion(&stack0xffffffffffffffc0,sourceRegion);
  }
  cVar5 = QRegion::isEmpty();
  if (cVar5 == '\0') {
    if (bVar13 == 0) {
LAB_0030372d:
      local_68 = 0;
    }
    else {
      lVar9 = *(long *)&this->field_0x8;
      do {
        plVar1 = (long *)(lVar9 + 8);
        lVar4 = *(long *)(*plVar1 + 0x10);
        if (lVar4 == 0) break;
        plVar2 = (long *)(lVar9 + 0x20);
        lVar9 = lVar4;
      } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
      lVar9 = *(long *)(*plVar1 + 0x78);
      if (lVar9 == 0) {
        lVar9 = 0;
      }
      else {
        lVar9 = *(long *)(lVar9 + 8);
      }
      if (lVar9 == 0) goto LAB_0030372d;
      local_68 = *(long *)(lVar9 + 0x18);
    }
    iVar6 = (**(code **)(*(long *)target + 0x10))();
    if (iVar6 == 1) {
      lVar9 = *(long *)(*(long *)(target + -8) + 0x78);
      if ((lVar9 != 0) && ((*(byte *)(lVar9 + 0x7c) & 0x40) != 0)) {
        lVar9 = *(long *)(*(long *)(target + -8) + 8);
        do {
          plVar1 = (long *)(lVar9 + 8);
          lVar4 = *(long *)(*plVar1 + 0x10);
          if (lVar4 == 0) break;
          plVar2 = (long *)(lVar9 + 0x20);
          lVar9 = lVar4;
        } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
        lVar9 = *(long *)(*plVar1 + 0x78);
        if (lVar9 == 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = *(long *)(lVar9 + 8);
        }
        if (lVar9 == 0) {
          pQVar11 = (QPainter *)0x0;
        }
        else {
          pQVar11 = *(QPainter **)(lVar9 + 0x18);
        }
        if (pQVar11 != (QPainter *)0x0) {
          cVar5 = QPainter::isActive();
          if (cVar5 != '\0') {
            setSharedPainter(this,pQVar11);
          }
        }
      }
    }
    local_48 = *targetOffset;
    uVar7 = QRegion::boundingRect();
    local_48.yp.m_i = local_48.yp.m_i - (int)((ulong)uVar7 >> 0x20);
    local_48.xp.m_i = local_48.xp.m_i - (int)uVar7;
    iVar6 = (**(code **)(*(long *)target + 0x10))(target);
    if (iVar6 == 1) {
      pQVar8 = *(QPaintDevice **)(*(long *)(target + -8) + 0xa8);
      pQVar10 = pQVar8;
      if (pQVar8 != (QPaintDevice *)0x0) {
        pQVar10 = *(QPaintDevice **)(*(long *)(target + -8) + 0x218);
      }
      iVar6 = (int)((ulong)pQVar10 >> 0x20);
    }
    else {
      pQVar10 = (QPaintDevice *)0x0;
      iVar6 = 0;
      pQVar8 = (QPaintDevice *)0x0;
    }
    if (pQVar8 != (QPaintDevice *)0x0) {
      local_48.yp.m_i = local_48.yp.m_i - iVar6;
      local_48.xp.m_i = local_48.xp.m_i - (int)pQVar10;
      target = pQVar8;
    }
    if (bVar13 == 0) {
      lVar9 = (**(code **)(*(long *)target + 0x18))(target);
      if (lVar9 != 0) {
        local_50.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QPaintEngine::systemClip();
        cVar5 = QRegion::isEmpty();
        if (cVar5 == '\0') {
          QRegion::translated((int)&local_58,(int)&local_50);
          QRegion::operator&=(&stack0xffffffffffffffc0,&local_58);
          QRegion::~QRegion(&local_58);
        }
        QRegion::~QRegion(&local_50);
      }
    }
    uVar12 = 0xe;
    if (((uint)renderFlags.super_QFlagsStorageHelper<QWidget::RenderFlag,_4>.
               super_QFlagsStorage<QWidget::RenderFlag>.i & 2) == 0) {
      uVar12 = 0x1a;
    }
    lVar9 = *(long *)&this->field_0x8;
    do {
      plVar1 = (long *)(lVar9 + 8);
      lVar4 = *(long *)(*plVar1 + 0x10);
      if (lVar4 == 0) break;
      plVar2 = (long *)(lVar9 + 0x20);
      lVar9 = lVar4;
    } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
    lVar9 = *(long *)(*plVar1 + 0x78);
    if (lVar9 == 0) {
      lVar9 = 0;
    }
    else {
      lVar9 = *(long *)(lVar9 + 8);
    }
    if (lVar9 == 0) {
      pQVar11 = (QPainter *)0x0;
    }
    else {
      pQVar11 = *(QPainter **)(lVar9 + 0x18);
    }
    drawWidget(this,target,&stack0xffffffffffffffc0,&local_48,
               (DrawWidgetFlags)
               (uVar12 | (uint)renderFlags.super_QFlagsStorageHelper<QWidget::RenderFlag,_4>.
                               super_QFlagsStorage<QWidget::RenderFlag>.i & 1 | 0x80),pQVar11,
               (QWidgetRepaintManager *)0x0);
    if (local_68 != 0) {
      lVar9 = *(long *)&this->field_0x8;
      do {
        this_00 = *(QWidgetPrivate **)(lVar9 + 8);
        if (*(long *)&this_00->field_0x10 == 0) break;
        plVar1 = (long *)(lVar9 + 0x20);
        lVar9 = *(long *)&this_00->field_0x10;
      } while ((*(uint *)(*plVar1 + 0xc) & 1) == 0);
      createTLExtra(this_00);
      *(long *)((long)(((this_00->extra)._M_t.
                        super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                      super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x18) =
           local_68;
    }
  }
  QRegion::~QRegion(&stack0xffffffffffffffc0);
LAB_00303954:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::render(QPaintDevice *target, const QPoint &targetOffset,
                            const QRegion &sourceRegion, QWidget::RenderFlags renderFlags)
{
    if (Q_UNLIKELY(!target)) {
        qWarning("QWidget::render: null pointer to paint device");
        return;
    }

    const bool inRenderWithPainter = extra && extra->inRenderWithPainter;
    QRegion paintRegion = !inRenderWithPainter
                          ? prepareToRender(sourceRegion, renderFlags)
                          : sourceRegion;
    if (paintRegion.isEmpty())
        return;

    QPainter *oldSharedPainter = inRenderWithPainter ? sharedPainter() : nullptr;

    // Use the target's shared painter if set (typically set when doing
    // "other->render(widget);" in the widget's paintEvent.
    if (target->devType() == QInternal::Widget) {
        QWidgetPrivate *targetPrivate = static_cast<QWidget *>(target)->d_func();
        if (targetPrivate->extra && targetPrivate->extra->inRenderWithPainter) {
            QPainter *targetPainter = targetPrivate->sharedPainter();
            if (targetPainter && targetPainter->isActive())
                setSharedPainter(targetPainter);
        }
    }

    // Use the target's redirected device if set and adjust offset and paint
    // region accordingly. This is typically the case when people call render
    // from the paintEvent.
    QPoint offset = targetOffset;
    offset -= paintRegion.boundingRect().topLeft();
    QPoint redirectionOffset;
    QPaintDevice *redirected = nullptr;

    if (target->devType() == QInternal::Widget)
        redirected = static_cast<QWidget *>(target)->d_func()->redirected(&redirectionOffset);

    if (redirected) {
        target = redirected;
        offset -= redirectionOffset;
    }

    if (!inRenderWithPainter) { // Clip handled by shared painter (in qpainter.cpp).
        if (QPaintEngine *targetEngine = target->paintEngine()) {
            const QRegion targetSystemClip = targetEngine->systemClip();
            if (!targetSystemClip.isEmpty())
                paintRegion &= targetSystemClip.translated(-offset);
        }
    }

    // Set backingstore flags.
    DrawWidgetFlags flags = DrawPaintOnScreen | DrawInvisible;
    if (renderFlags & QWidget::DrawWindowBackground)
        flags |= DrawAsRoot;

    if (renderFlags & QWidget::DrawChildren)
        flags |= DrawRecursive;
    else
        flags |= DontSubtractOpaqueChildren;

    flags |= DontSetCompositionMode;

    // Render via backingstore.
    drawWidget(target, paintRegion, offset, flags, sharedPainter());

    // Restore shared painter.
    if (oldSharedPainter)
        setSharedPainter(oldSharedPainter);
}